

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::Image>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  deUint32 dVar1;
  Resources *pRVar2;
  reference pvVar3;
  CreateThread<vkt::api::(anonymous_namespace)::Image> *this;
  DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread> local_e1;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_e0;
  SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources> local_d0;
  uint local_bc;
  undefined1 local_b8 [4];
  deUint32 ndx;
  ThreadGroup threads;
  allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_> local_71;
  undefined1 local_70 [8];
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>_>
  resources;
  Environment env;
  deUint32 numThreads;
  Context *context_local;
  
  dVar1 = getDefaultTestThreadCount();
  Environment::Environment
            ((Environment *)
             &resources.
              super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,context,1);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>::allocator
            (&local_71);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>_>
  ::vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>_>
            *)local_70,(ulong)dVar1,&local_71);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>::~allocator
            (&local_71);
  ThreadGroup::ThreadGroup((ThreadGroup *)local_b8);
  for (local_bc = 0; local_bc < dVar1; local_bc = local_bc + 1) {
    pRVar2 = (Resources *)operator_new(1);
    Image::Resources::Resources
              (pRVar2,(Environment *)
                      &resources.
                       super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&params);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>::SharedPtr(&local_d0,pRVar2);
    pvVar3 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>_>
                           *)local_70,(ulong)local_bc);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>::operator=(pvVar3,&local_d0);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>::~SharedPtr(&local_d0);
    this = (CreateThread<vkt::api::(anonymous_namespace)::Image> *)operator_new(0x88);
    pvVar3 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>_>
                           *)local_70,(ulong)local_bc);
    pRVar2 = de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>::operator*(pvVar3);
    CreateThread<vkt::api::(anonymous_namespace)::Image>::CreateThread
              (this,(Environment *)
                    &resources.
                     super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pRVar2,&params);
    de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>::DefaultDeleter
              (&local_e1);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::MovePtr(&local_e0,this);
    ThreadGroup::add((ThreadGroup *)local_b8,&local_e0);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::~MovePtr(&local_e0);
  }
  ThreadGroup::run(__return_storage_ptr__,(ThreadGroup *)local_b8);
  ThreadGroup::~ThreadGroup((ThreadGroup *)local_b8);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>_>
  ::~vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>_>_>
             *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}